

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmInstructionType anon_unknown.dwarf_aa461::GetOperationWithLoad(VmInstructionType cmd)

{
  VmInstructionType local_c;
  VmInstructionType cmd_local;
  
  switch(cmd) {
  case VM_INST_ADD:
    local_c = VM_INST_ADD_LOAD;
    break;
  case VM_INST_SUB:
    local_c = VM_INST_SUB_LOAD;
    break;
  case VM_INST_MUL:
    local_c = VM_INST_MUL_LOAD;
    break;
  case VM_INST_DIV:
    local_c = VM_INST_DIV_LOAD;
    break;
  case VM_INST_POW:
    local_c = VM_INST_POW_LOAD;
    break;
  case VM_INST_MOD:
    local_c = VM_INST_MOD_LOAD;
    break;
  case VM_INST_LESS:
    local_c = VM_INST_LESS_LOAD;
    break;
  case VM_INST_GREATER:
    local_c = VM_INST_GREATER_LOAD;
    break;
  case VM_INST_LESS_EQUAL:
    local_c = VM_INST_LESS_EQUAL_LOAD;
    break;
  case VM_INST_GREATER_EQUAL:
    local_c = VM_INST_GREATER_EQUAL_LOAD;
    break;
  case VM_INST_EQUAL:
    local_c = VM_INST_EQUAL_LOAD;
    break;
  case VM_INST_NOT_EQUAL:
    local_c = VM_INST_NOT_EQUAL_LOAD;
    break;
  case VM_INST_SHL:
    local_c = VM_INST_SHL_LOAD;
    break;
  case VM_INST_SHR:
    local_c = VM_INST_SHR_LOAD;
    break;
  case VM_INST_BIT_AND:
    local_c = VM_INST_BIT_AND_LOAD;
    break;
  case VM_INST_BIT_OR:
    local_c = VM_INST_BIT_OR_LOAD;
    break;
  case VM_INST_BIT_XOR:
    local_c = VM_INST_BIT_XOR_LOAD;
    break;
  default:
    __assert_fail("!\"unknown operation\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xdf,
                  "VmInstructionType (anonymous namespace)::GetOperationWithLoad(VmInstructionType)"
                 );
  }
  return local_c;
}

Assistant:

VmInstructionType GetOperationWithLoad(VmInstructionType cmd)
	{
		switch(cmd)
		{
		case VM_INST_ADD:
			return VM_INST_ADD_LOAD;
		case VM_INST_SUB:
			return VM_INST_SUB_LOAD;
		case VM_INST_MUL:
			return VM_INST_MUL_LOAD;
		case VM_INST_DIV:
			return VM_INST_DIV_LOAD;
		case VM_INST_POW:
			return VM_INST_POW_LOAD;
		case VM_INST_MOD:
			return VM_INST_MOD_LOAD;
		case VM_INST_LESS:
			return VM_INST_LESS_LOAD;
		case VM_INST_GREATER:
			return VM_INST_GREATER_LOAD;
		case VM_INST_LESS_EQUAL:
			return VM_INST_LESS_EQUAL_LOAD;
		case VM_INST_GREATER_EQUAL:
			return VM_INST_GREATER_EQUAL_LOAD;
		case VM_INST_EQUAL:
			return VM_INST_EQUAL_LOAD;
		case VM_INST_NOT_EQUAL:
			return VM_INST_NOT_EQUAL_LOAD;
		case VM_INST_SHL:
			return VM_INST_SHL_LOAD;
		case VM_INST_SHR:
			return VM_INST_SHR_LOAD;
		case VM_INST_BIT_AND:
			return VM_INST_BIT_AND_LOAD;
		case VM_INST_BIT_OR:
			return VM_INST_BIT_OR_LOAD;
		case VM_INST_BIT_XOR:
			return VM_INST_BIT_XOR_LOAD;
		default:
			break;
		}

		assert(!"unknown operation");
		return VM_INST_ABORT_NO_RETURN;
	}